

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportStateBaseCase::initialize(ViewportStateBaseCase *this)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  RGBA local_7c;
  undefined1 local_78 [24];
  Vec4 local_60;
  PositionColorVertex local_50;
  
  (this->super_DynamicStateBaseClass).m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  this_00 = &(this->super_DynamicStateBaseClass).m_data;
  local_78._0_4_ = -0.5;
  local_78._4_4_ = 0.5;
  local_78._8_8_ = &DAT_3f8000003f800000;
  local_7c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_7c);
  PositionColorVertex::PositionColorVertex(&local_50,(Vec4 *)local_78,&local_60);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  local_78._0_4_ = 0.5;
  local_78._4_4_ = 0.5;
  local_78._8_8_ = &DAT_3f8000003f800000;
  local_7c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_7c);
  PositionColorVertex::PositionColorVertex(&local_50,(Vec4 *)local_78,&local_60);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  local_78._0_4_ = -0.5;
  local_78._4_4_ = -0.5;
  local_78._8_8_ = &DAT_3f8000003f800000;
  local_7c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_7c);
  PositionColorVertex::PositionColorVertex(&local_50,(Vec4 *)local_78,&local_60);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  local_78._0_4_ = 0.5;
  local_78._4_4_ = -0.5;
  local_78._8_8_ = &DAT_3f8000003f800000;
  local_7c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_7c);
  PositionColorVertex::PositionColorVertex(&local_50,(Vec4 *)local_78,&local_60);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

void initialize(void)
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}